

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Index * sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,
                          ExprList *pList,int onError,Token *pStart,Expr *pPIWhere,int sortOrder,
                          int ifNotExist)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  sqlite3 *db;
  Expr *pEVar5;
  i16 *piVar6;
  i16 *piVar7;
  long lVar8;
  u8 uVar9;
  int iVar10;
  uint uVar11;
  Table *pTVar12;
  char *zName;
  Index *pIVar13;
  Table *pTVar14;
  CollSeq *pCVar15;
  ulong uVar16;
  void *pvVar17;
  Vdbe *p;
  Index *pIVar18;
  u16 uVar19;
  ExprList_item *pEVar20;
  int iVar21;
  Schema **ppSVar22;
  Db *pDVar23;
  Column *pCVar24;
  size_t __n;
  char *pcVar25;
  char *pcVar26;
  long lVar27;
  short *psVar28;
  int iVar29;
  uint uVar30;
  Index *pIVar31;
  bool bVar32;
  Index *local_f0;
  Index *local_d8;
  ulong local_d0;
  ExprList *local_c8;
  char *local_b8;
  char *local_a0;
  ulong local_98;
  Token *pName;
  ulong local_88;
  Token *local_80;
  long local_78;
  Column *local_70;
  char *local_68;
  DbFixer sFix;
  
  db = pParse->db;
  zName = (char *)0x0;
  pName = (Token *)0x0;
  local_a0 = (char *)0x0;
  local_c8 = pList;
  if (db->mallocFailed != '\0') goto LAB_00142ffa;
  if ((pParse->declareVtab != '\0') || (iVar10 = sqlite3ReadSchema(pParse), iVar10 != 0)) {
LAB_00142ff7:
    zName = (char *)0x0;
    goto LAB_00142ffa;
  }
  if (pTblName == (SrcList *)0x0) {
    pTVar12 = pParse->pNewTable;
    if (pTVar12 == (Table *)0x0) goto LAB_00142ff7;
    uVar16 = 0;
    if (pTVar12->pSchema == (Schema *)0x0) {
      uVar16 = 0xfff0bdc0;
LAB_001431d1:
      local_f0 = (Index *)0x0;
    }
    else {
      uVar11 = db->nDb;
      if ((int)uVar11 < 1) goto LAB_001431d1;
      ppSVar22 = &db->aDb->pSchema;
      uVar16 = 0;
      do {
        if (*ppSVar22 == pTVar12->pSchema) goto LAB_001431d1;
        uVar16 = uVar16 + 1;
        ppSVar22 = ppSVar22 + 4;
      } while (uVar11 != uVar16);
      local_f0 = (Index *)0x0;
      uVar16 = (ulong)uVar11;
    }
LAB_001431e1:
    local_78 = (long)(int)uVar16 * 0x20;
    pDVar23 = db->aDb + (int)uVar16;
    pcVar26 = pTVar12->zName;
    iVar10 = sqlite3_strnicmp(pcVar26,"sqlite_",7);
    if (((iVar10 == 0) && ((db->init).busy == '\0')) &&
       (iVar10 = sqlite3_strnicmp(pcVar26 + 7,"altertab_",9), iVar10 != 0)) {
      pcVar25 = "table %s may not be indexed";
      goto LAB_00143312;
    }
    if (pTVar12->pSelect != (Select *)0x0) {
      pcVar26 = "views may not be indexed";
LAB_001432d3:
      zName = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar26);
      goto LAB_00142ffa;
    }
    if ((pTVar12->tabFlags & 0x10) != 0) {
      pcVar26 = "virtual tables may not be indexed";
      goto LAB_001432d3;
    }
    local_80 = pName;
    local_98 = uVar16;
    if (pName != (Token *)0x0) {
      zName = sqlite3NameFromToken(db,pName);
      if (zName == (char *)0x0) goto LAB_00142ff7;
      iVar10 = sqlite3CheckObjectName(pParse,zName);
      if (iVar10 == 0) {
        if (((db->init).busy == '\0') &&
           (pTVar14 = sqlite3FindTable(db,zName,(char *)0x0), pTVar14 != (Table *)0x0)) {
          pcVar26 = "there is already a table named %s";
        }
        else {
          pIVar13 = sqlite3FindIndex(db,zName,pDVar23->zName);
          if (pIVar13 == (Index *)0x0) goto LAB_00143362;
          if (ifNotExist != 0) {
            sqlite3CodeVerifySchema(pParse,(int)local_98);
            goto LAB_00142ffa;
          }
          pcVar26 = "index %s already exists";
        }
        pIVar13 = (Index *)0x0;
        sqlite3ErrorMsg(pParse,pcVar26,zName);
        goto LAB_00142ffc;
      }
      goto LAB_00142ffa;
    }
    for (pIVar13 = pTVar12->pIndex; pIVar13 != (Index *)0x0; pIVar13 = pIVar13->pNext) {
    }
    pIVar13 = (Index *)0x0;
    zName = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d",pcVar26);
    if (zName != (char *)0x0) {
LAB_00143362:
      pcVar26 = pDVar23->zName;
      pcVar25 = "sqlite_master";
      if ((int)local_98 == 1) {
        pcVar25 = "sqlite_temp_master";
      }
      pIVar13 = (Index *)0x0;
      iVar10 = sqlite3AuthCheck(pParse,0x12,pcVar25,(char *)0x0,pcVar26);
      if (iVar10 == 0) {
        local_68 = pcVar25;
        iVar10 = sqlite3AuthCheck(pParse,(uint)((int)local_98 == 1) * 2 + 1,zName,pTVar12->zName,
                                  pcVar26);
        if (iVar10 != 0) goto LAB_00142ffa;
        if (pList == (ExprList *)0x0) {
          pIVar13 = (Index *)0x0;
          pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,(Expr *)0x0);
          if (pList == (ExprList *)0x0) {
            local_d8 = (Index *)0x0;
            local_c8 = (ExprList *)0x0;
            goto LAB_00142ffe;
          }
          pcVar26 = sqlite3DbStrDup(pParse->db,pTVar12->aCol[(long)pTVar12->nCol + -1].zName);
          pEVar20 = pList->a;
          pEVar20->zName = pcVar26;
          pEVar20->sortOrder = (u8)sortOrder;
        }
        iVar10 = pList->nExpr;
        if ((long)iVar10 < 1) {
          iVar21 = 1;
        }
        else {
          lVar27 = 0;
          iVar21 = 0;
          do {
            pEVar5 = pList->a[lVar27].pExpr;
            if (pEVar5 != (Expr *)0x0) {
              pcVar26 = (pEVar5->u).zToken;
              if (pcVar26 == (char *)0x0) {
                iVar29 = 1;
              }
              else {
                uVar11 = 0xffffffff;
                do {
                  uVar11 = uVar11 + 1;
                  cVar1 = *pcVar26;
                  pcVar26 = pcVar26 + 1;
                } while (cVar1 != '\0');
                iVar29 = (uVar11 & 0x3fffffff) + 1;
              }
              iVar21 = iVar21 + iVar29;
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != iVar10);
          iVar21 = iVar21 + 1;
        }
        lVar27 = 0;
        do {
          pcVar26 = zName + lVar27;
          lVar27 = lVar27 + 1;
        } while (*pcVar26 != '\0');
        uVar11 = (int)lVar27 - 1U & 0x3fffffff;
        if (local_f0 == (Index *)0x0) {
          uVar19 = 1;
        }
        else {
          uVar19 = local_f0->nKeyCol;
        }
        pIVar13 = sqlite3AllocateIndexObject(db,(short)iVar10 + uVar19,iVar21 + uVar11,&local_a0);
        pcVar26 = local_a0;
        local_c8 = pList;
        if (db->mallocFailed != '\0') goto LAB_00142ffc;
        bVar32 = local_80 == (Token *)0x0;
        pIVar13->zName = local_a0;
        local_a0 = local_a0 + (ulong)uVar11 + 1;
        memcpy(pcVar26,zName,(ulong)uVar11 + 1);
        pIVar13->pTable = pTVar12;
        pIVar13->onError = (u8)onError;
        pIVar13->field_0x5b = pIVar13->field_0x5b & 0xf4 | (onError != 0) * '\b' + bVar32;
        pIVar13->pSchema = *(Schema **)((long)&db->aDb->pSchema + local_78);
        pIVar13->nKeyCol = (u16)pList->nExpr;
        if (pPIWhere != (Expr *)0x0) {
          sqlite3ResolveSelfReference(pParse,pTVar12,0x10,pPIWhere,(ExprList *)0x0);
          pIVar13->pPartIdxWhere = pPIWhere;
        }
        local_b8 = local_a0;
        if (pList->nExpr < 1) {
          local_d0 = 0;
        }
        else {
          bVar2 = pDVar23->pSchema->file_format;
          pEVar20 = pList->a;
          local_d0 = 0;
          do {
            pcVar26 = pEVar20->zName;
            uVar11 = (uint)pTVar12->nCol;
            local_88 = (ulong)uVar11;
            bVar32 = 0 < (int)uVar11;
            if ((int)uVar11 < 1) {
LAB_001436d6:
              sqlite3ErrorMsg(pParse,"table %s has no column named %s",pTVar12->zName,pcVar26);
              pParse->checkSchema = '\x01';
LAB_001436fc:
              bVar32 = false;
            }
            else {
              pCVar24 = pTVar12->aCol;
              iVar10 = sqlite3_stricmp(pcVar26,pCVar24->zName);
              local_70 = pCVar24;
              if (iVar10 == 0) {
                uVar16 = 0;
              }
              else {
                iVar10 = (int)local_88;
                uVar16 = 0;
                do {
                  pCVar24 = pCVar24 + 1;
                  if (iVar10 + -1 == (int)uVar16) goto LAB_001436d6;
                  iVar21 = sqlite3_stricmp(pcVar26,pCVar24->zName);
                  uVar11 = (int)uVar16 + 1;
                  uVar16 = (ulong)uVar11;
                } while (iVar21 != 0);
                bVar32 = (int)uVar11 < (int)local_88;
              }
              if (!bVar32) goto LAB_001436d6;
              pIVar13->aiColumn[local_d0] = (i16)uVar16;
              if (pEVar20->pExpr == (Expr *)0x0) {
                pcVar26 = local_70[uVar16].zColl;
                pcVar25 = local_b8;
                if (pcVar26 == (char *)0x0) {
                  pcVar26 = "BINARY";
                }
              }
              else {
                pcVar26 = (pEVar20->pExpr->u).zToken;
                if (pcVar26 == (char *)0x0) {
                  __n = 1;
                }
                else {
                  lVar27 = -1;
                  do {
                    lVar8 = lVar27 + 1;
                    lVar27 = lVar27 + 1;
                  } while (pcVar26[lVar8] != '\0');
                  __n = (ulong)((uint)lVar27 & 0x3fffffff) + 1;
                }
                memcpy(local_b8,pcVar26,__n);
                pcVar25 = local_b8 + __n;
                pcVar26 = local_b8;
              }
              local_b8 = pcVar25;
              if (((db->init).busy == '\0') &&
                 (pCVar15 = sqlite3LocateCollSeq(pParse,pcVar26), pCVar15 == (CollSeq *)0x0))
              goto LAB_001436fc;
              uVar9 = '\0';
              pIVar13->azColl[local_d0] = pcVar26;
              if (3 < bVar2) {
                uVar9 = (u8)*(undefined4 *)&pEVar20->sortOrder;
              }
              pIVar13->aSortOrder[local_d0] = uVar9;
              bVar32 = true;
              if (pTVar12->aCol[uVar16].notNull == '\0') {
                pIVar13->field_0x5b = pIVar13->field_0x5b & 0xf7;
              }
            }
            if (!bVar32) {
              local_a0 = local_b8;
              pPIWhere = (Expr *)0x0;
              goto LAB_00142ffc;
            }
            local_d0 = local_d0 + 1;
            pEVar20 = pEVar20 + 1;
          } while ((long)local_d0 < (long)pList->nExpr);
        }
        local_a0 = local_b8;
        if (local_f0 == (Index *)0x0) {
          pIVar13->aiColumn[local_d0 & 0xffffffff] = -1;
          pIVar13->azColl[local_d0 & 0xffffffff] = "BINARY";
        }
        else if (local_f0->nKeyCol != 0) {
          uVar16 = 0;
          do {
            psVar28 = pIVar13->aiColumn;
            uVar11 = (uint)pIVar13->nKeyCol;
            do {
              uVar30 = uVar11;
              if ((int)uVar30 < 1) goto LAB_00143871;
              sVar3 = *psVar28;
              psVar28 = psVar28 + 1;
              uVar11 = uVar30 - 1;
            } while (sVar3 != local_f0->aiColumn[uVar16]);
            if ((int)uVar30 < 1) {
LAB_00143871:
              iVar10 = (int)local_d0;
              pIVar13->aiColumn[iVar10] = local_f0->aiColumn[uVar16];
              pIVar13->azColl[iVar10] = local_f0->azColl[uVar16];
              pIVar13->aSortOrder[iVar10] = local_f0->aSortOrder[uVar16];
              local_d0 = (ulong)(iVar10 + 1);
            }
            else {
              pIVar13->nColumn = pIVar13->nColumn - 1;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < local_f0->nKeyCol);
        }
        sqlite3DefaultRowEst(pIVar13);
        if (pParse->pNewTable == (Table *)0x0) {
          estimateIndexWidth(pIVar13);
        }
        iVar10 = 0;
        if (pTVar12 == pParse->pNewTable) {
          pIVar31 = pTVar12->pIndex;
          if (pIVar31 == (Index *)0x0) {
            local_d8 = (Index *)0x0;
          }
          else {
            local_d8 = (Index *)0x0;
            do {
              uVar4 = pIVar31->nKeyCol;
              iVar10 = 0x14;
              if (uVar4 == pIVar13->nKeyCol) {
                uVar16 = 0;
                uVar11 = (uint)uVar4;
                if (uVar11 != 0) {
                  piVar6 = pIVar31->aiColumn;
                  piVar7 = pIVar13->aiColumn;
                  uVar16 = 0;
                  do {
                    if (piVar6[uVar16] != piVar7[uVar16]) goto LAB_001439e3;
                    if ((pIVar31->azColl[uVar16] != pIVar13->azColl[uVar16]) &&
                       (iVar10 = sqlite3_stricmp(pIVar31->azColl[uVar16],pIVar13->azColl[uVar16]),
                       iVar10 != 0)) goto LAB_001439e3;
                    uVar16 = uVar16 + 1;
                  } while (uVar11 != uVar16);
                  uVar16 = (ulong)uVar11;
                }
LAB_001439e3:
                iVar10 = 0;
                if ((uint)uVar16 == (uint)uVar4) {
                  if (pIVar31->onError != pIVar13->onError) {
                    if ((pIVar31->onError != '\n') && (pIVar13->onError != '\n')) {
                      sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
                    }
                    if (pIVar31->onError == '\n') {
                      pIVar31->onError = pIVar13->onError;
                    }
                  }
                  iVar10 = 2;
                  local_d8 = pIVar31;
                }
              }
              if ((iVar10 != 0x14) && (iVar10 != 0)) goto LAB_00143c66;
              pIVar31 = pIVar31->pNext;
            } while (pIVar31 != (Index *)0x0);
            iVar10 = 0;
          }
LAB_00143c66:
          if (iVar10 == 0) goto LAB_0014390b;
          if (iVar10 != 2) {
            return pIVar13;
          }
        }
        else {
          local_d8 = (Index *)0x0;
LAB_0014390b:
          if ((db->init).busy == '\0') {
            if ((pParse->nErr != 0) ||
               ((pTblName == (SrcList *)0x0 && ((pTVar12->tabFlags & 0x20) != 0))))
            goto LAB_00143bf6;
            uVar11 = pParse->nMem + 1;
            pParse->nMem = uVar11;
            p = sqlite3GetVdbe(pParse);
            if (p != (Vdbe *)0x0) {
              iVar10 = (int)local_98;
              sqlite3BeginWriteOperation(pParse,1,iVar10);
              local_f0 = (Index *)0x0;
              sqlite3VdbeAddOp3(p,0x78,iVar10,uVar11,0);
              if (pStart != (Token *)0x0) {
                iVar10 = (*(int *)&(pParse->sLastToken).z - (int)local_80->z) +
                         (pParse->sLastToken).n;
                pcVar26 = " UNIQUE";
                if (onError == 0) {
                  pcVar26 = "";
                }
                local_f0 = (Index *)sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar26,
                                                   (ulong)(iVar10 - (uint)(local_80->z
                                                                           [(long)iVar10 + -1] ==
                                                                          ';')));
              }
              sqlite3NestedParse(pParse,"INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                 *(undefined8 *)((long)&db->aDb->zName + local_78),local_68,
                                 pIVar13->zName,pTVar12->zName,(ulong)uVar11,local_f0);
              sqlite3DbFree(db,local_f0);
              if (pTblName != (SrcList *)0x0) {
                sqlite3RefillIndex(pParse,pIVar13,uVar11);
                iVar10 = (int)local_98;
                sqlite3ChangeCookie(pParse,iVar10);
                pcVar26 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",pIVar13->zName);
                sqlite3VdbeAddParseSchemaOp(p,iVar10,pcVar26);
                sqlite3VdbeAddOp3(p,0x90,0,0,0);
              }
              if (p != (Vdbe *)0x0) goto LAB_00143bf6;
            }
          }
          else {
            pvVar17 = sqlite3HashInsert(&pIVar13->pSchema->idxHash,pIVar13->zName,pIVar13);
            if (pvVar17 == (void *)0x0) {
              *(byte *)&db->flags = (byte)db->flags | 2;
              if (pTblName != (SrcList *)0x0) {
                pIVar13->tnum = (db->init).newTnum;
              }
            }
            else {
              db->mallocFailed = '\x01';
            }
            if (pvVar17 == (void *)0x0) {
LAB_00143bf6:
              if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
                if ((onError == 5) &&
                   ((pIVar31 = pTVar12->pIndex, pIVar31 != (Index *)0x0 &&
                    (pIVar31->onError != '\x05')))) {
                  do {
                    pIVar18 = pIVar31;
                    pIVar31 = pIVar18->pNext;
                    if (pIVar31 == (Index *)0x0) break;
                  } while (pIVar31->onError != '\x05');
                  pIVar13->pNext = pIVar31;
                  pIVar18->pNext = pIVar13;
                }
                else {
                  pIVar13->pNext = pTVar12->pIndex;
                  pTVar12->pIndex = pIVar13;
                }
                pPIWhere = (Expr *)0x0;
                local_d8 = pIVar13;
                pIVar13 = (Index *)0x0;
                goto LAB_00142ffe;
              }
            }
          }
        }
        pPIWhere = (Expr *)0x0;
        goto LAB_00142ffe;
      }
    }
  }
  else {
    uVar11 = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
    if ((int)uVar11 < 0) goto LAB_00142ff7;
    uVar16 = (ulong)uVar11;
    if ((((db->init).busy == '\0') &&
        (pTVar12 = sqlite3SrcListLookup(pParse,pTblName), pTVar12 != (Table *)0x0 && pName2->n == 0)
        ) && (pTVar12->pSchema == db->aDb[1].pSchema)) {
      uVar16 = 1;
    }
    pDVar23 = pParse->db->aDb;
    iVar10 = (int)uVar16;
    sFix.zDb = pDVar23[iVar10].zName;
    sFix.pSchema = pDVar23[iVar10].pSchema;
    sFix.zType = "index";
    sFix.pName = pName;
    sFix.bVarOnly = (int)(iVar10 == 1);
    sFix.pParse = pParse;
    sqlite3FixSrcList(&sFix,pTblName);
    zName = (char *)0x0;
    pTVar12 = sqlite3LocateTableItem(pParse,0,pTblName->a);
    if (pTVar12 == (Table *)0x0) goto LAB_00142ffa;
    if ((iVar10 != 1) || (db->aDb[1].pSchema == pTVar12->pSchema)) {
      if ((pTVar12->tabFlags & 0x20) != 0) {
        for (local_f0 = pTVar12->pIndex;
            (local_f0 != (Index *)0x0 && ((local_f0->field_0x5b & 3) != 2));
            local_f0 = local_f0->pNext) {
        }
        goto LAB_001431e1;
      }
      goto LAB_001431d1;
    }
    pcVar26 = pTVar12->zName;
    pcVar25 = "cannot create a TEMP index on non-TEMP table \"%s\"";
LAB_00143312:
    zName = (char *)0x0;
    sqlite3ErrorMsg(pParse,pcVar25,pcVar26);
LAB_00142ffa:
    pIVar13 = (Index *)0x0;
  }
LAB_00142ffc:
  local_d8 = (Index *)0x0;
LAB_00142ffe:
  if (pIVar13 != (Index *)0x0) {
    freeIndex(db,pIVar13);
  }
  sqlite3ExprDelete(db,pPIWhere);
  sqlite3ExprListDelete(db,local_c8);
  sqlite3SrcListDelete(db,pTblName);
  sqlite3DbFree(db,zName);
  return local_d8;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist     /* Omit error if index already exists */
){
  Index *pRet = 0;     /* Pointer to return */
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  const Column *pTabCol;           /* A column in the table */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  assert( pParse->nErr==0 );      /* Never called with prior errors */
  if( db->mallocFailed || IN_DECLARE_VTAB ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
       && sqlite3StrNICmp(&pTab->zName[7],"altertab_",9)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !db->init.busy ){
      if( sqlite3FindTable(db, zName, 0)!=0 ){
        sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
        goto exit_create_index;
      }
    }
    if( sqlite3FindIndex(db, zName, pDb->zName)!=0 ){
      if( !ifNotExist ){
        sqlite3ErrorMsg(pParse, "index %s already exists", zName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto exit_create_index;
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    const char *zDb = pDb->zName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    pList = sqlite3ExprListAppend(pParse, 0, 0);
    if( pList==0 ) goto exit_create_index;
    pList->a[0].zName = sqlite3DbStrDup(pParse->db,
                                        pTab->aCol[pTab->nCol-1].zName);
    pList->a[0].sortOrder = (u8)sortOrder;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr ){
      assert( pExpr->op==TK_COLLATE );
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = pName ? SQLITE_IDXTYPE_APPDEF : SQLITE_IDXTYPE_UNIQUE;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Scan the names of the columns of the table to be indexed and
  ** load the column indices into the Index structure.  Report an error
  ** if any column is not found.
  **
  ** TODO:  Add a test to make sure that the same column is not named
  ** more than once within the same index.  Only the first instance of
  ** the column will ever be used by the optimizer.  Note that using the
  ** same column more than once cannot be an error because that would 
  ** break backwards compatibility - it needs to be a warning.
  */
  for(i=0, pListItem=pList->a; i<pList->nExpr; i++, pListItem++){
    const char *zColName = pListItem->zName;
    int requestedSortOrder;
    char *zColl;                   /* Collation sequence name */

    for(j=0, pTabCol=pTab->aCol; j<pTab->nCol; j++, pTabCol++){
      if( sqlite3StrICmp(zColName, pTabCol->zName)==0 ) break;
    }
    if( j>=pTab->nCol ){
      sqlite3ErrorMsg(pParse, "table %s has no column named %s",
        pTab->zName, zColName);
      pParse->checkSchema = 1;
      goto exit_create_index;
    }
    assert( j<=0x7fff );
    pIndex->aiColumn[i] = (i16)j;
    if( pListItem->pExpr ){
      int nColl;
      assert( pListItem->pExpr->op==TK_COLLATE );
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else{
      zColl = pTab->aCol[j].zColl;
      if( !zColl ) zColl = "BINARY";
    }
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
    if( pTab->aCol[j].notNull==0 ) pIndex->uniqNotNull = 0;
  }
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = -1;
    pIndex->azColl[i] = "BINARY";
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( z1!=z2 && sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        pRet = pIdx;
        goto exit_create_index;
      }
    }
  }

  /* Link the new Index structure to its table and to the other
  ** in-memory database structures. 
  */
  if( db->init.busy ){
    Index *p;
    assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
    p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
                          pIndex->zName, pIndex);
    if( p ){
      assert( p==pIndex );  /* Malloc must have failed */
      db->mallocFailed = 1;
      goto exit_create_index;
    }
    db->flags |= SQLITE_InternChanges;
    if( pTblName!=0 ){
      pIndex->tnum = db->init.newTnum;
    }
  }

  /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
  ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
  ** emit code to allocate the index rootpage on disk and make an entry for
  ** the index in the sqlite_master table and populate the index with
  ** content.  But, do not do this if we are simply reading the sqlite_master
  ** table to parse the schema, or if this index is the PRIMARY KEY index
  ** of a WITHOUT ROWID table.
  **
  ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
  ** or UNIQUE index in a CREATE TABLE statement.  Since the table
  ** has just been created, it contains no data and the index initialization
  ** step can be skipped.
  */
  else if( pParse->nErr==0 && (HasRowid(pTab) || pTblName!=0) ){
    Vdbe *v;
    char *zStmt;
    int iMem = ++pParse->nMem;

    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto exit_create_index;


    /* Create the rootpage for the index
    */
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3VdbeAddOp2(v, OP_CreateIndex, iDb, iMem);

    /* Gather the complete text of the CREATE INDEX statement into
    ** the zStmt variable
    */
    if( pStart ){
      int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
      if( pName->z[n-1]==';' ) n--;
      /* A named index with an explicit CREATE INDEX statement */
      zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
        onError==OE_None ? "" : " UNIQUE", n, pName->z);
    }else{
      /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
      /* zStmt = sqlite3MPrintf(""); */
      zStmt = 0;
    }

    /* Add an entry in sqlite_master for this index
    */
    sqlite3NestedParse(pParse, 
        "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
        db->aDb[iDb].zName, SCHEMA_TABLE(iDb),
        pIndex->zName,
        pTab->zName,
        iMem,
        zStmt
    );
    sqlite3DbFree(db, zStmt);

    /* Fill the index with data and reparse the schema. Code an OP_Expire
    ** to invalidate all pre-compiled statements.
    */
    if( pTblName ){
      sqlite3RefillIndex(pParse, pIndex, iMem);
      sqlite3ChangeCookie(pParse, iDb);
      sqlite3VdbeAddParseSchemaOp(v, iDb,
         sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
      sqlite3VdbeAddOp1(v, OP_Expire, 0);
    }
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pRet = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) freeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
  return pRet;
}